

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

word Abc_SopToTruth(char *pSop,int nInputs)

{
  char cVar1;
  uint uVar2;
  char *pCur;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  word *pwVar9;
  ulong uVar10;
  
  iVar4 = 2;
  for (pcVar3 = pSop; *pcVar3 != '\n'; pcVar3 = pcVar3 + 1) {
    if (*pcVar3 == '\0') goto LAB_001efee9;
    iVar4 = iVar4 + -1;
  }
  uVar2 = -iVar4;
  if (uVar2 < 7) {
    if (iVar4 + nInputs != 0) {
      __assert_fail("nVars == nInputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                    ,0x49b,"word Abc_SopToTruth(char *, int)");
    }
    uVar5 = 0;
    lVar7 = 0;
    do {
      iVar4 = (int)lVar7;
      if (nInputs == 0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        lVar7 = (long)iVar4;
        iVar4 = uVar2 + iVar4;
        uVar6 = 0xffffffffffffffff;
        pwVar9 = Abc_SopToTruth::Truth;
        uVar10 = 0;
        do {
          cVar1 = pSop[uVar10 + lVar7];
          if (cVar1 != '-') {
            if (cVar1 == '0') {
              uVar6 = uVar6 & ~*pwVar9;
            }
            else {
              if (cVar1 != '1') {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                              ,0x4a5,"word Abc_SopToTruth(char *, int)");
              }
              uVar6 = uVar6 & *pwVar9;
            }
          }
          uVar10 = uVar10 + 1;
          pwVar9 = pwVar9 + 1;
        } while (uVar2 != uVar10);
      }
      lVar8 = (long)iVar4;
      if (pSop[lVar8] != ' ') {
        __assert_fail("pSop[lit] == \' \'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                      ,0x4a8,"word Abc_SopToTruth(char *, int)");
      }
      if (pSop[lVar8 + 2] != '\n') {
        __assert_fail("pSop[lit] == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                      ,0x4ab,"word Abc_SopToTruth(char *, int)");
      }
      uVar5 = uVar5 | uVar6;
      lVar7 = lVar8 + 3;
    } while (pSop[lVar8 + 3] != '\0');
    iVar4 = Abc_SopIsComplement(pSop);
    return uVar5 ^ (long)-iVar4;
  }
LAB_001efee9:
  __assert_fail("nVars >= 0 && nVars <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                ,0x49a,"word Abc_SopToTruth(char *, int)");
}

Assistant:

word Abc_SopToTruth( char * pSop, int nInputs )
{
    static word Truth[8] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000),
        ABC_CONST(0x0000000000000000),
        ABC_CONST(0xFFFFFFFFFFFFFFFF)
    };
    word Cube, Result = 0;
    int v, lit = 0;
    int nVars = Abc_SopGetVarNum(pSop);
    assert( nVars >= 0 && nVars <= 6 );
    assert( nVars == nInputs );
    do {
        Cube = Truth[7];
        for ( v = 0; v < nVars; v++, lit++ )
        {
            if ( pSop[lit] == '1' )
                Cube &=  Truth[v];
            else if ( pSop[lit] == '0' )
                Cube &= ~Truth[v];
            else if ( pSop[lit] != '-' )
                assert( 0 );
        }
        Result |= Cube;
        assert( pSop[lit] == ' ' );
        lit++;
        lit++;
        assert( pSop[lit] == '\n' );
        lit++;
    } while ( pSop[lit] );
    if ( Abc_SopIsComplement(pSop) )
        Result = ~Result;
    return Result;
}